

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined8 uVar1;
  char cVar2;
  ImDrawList **ppIVar3;
  ImTextureID pvVar4;
  long in_RDI;
  ImVec2 clip_max;
  ImVec2 clip_min;
  ImDrawCmd *pcmd;
  int cmd_i;
  GLsizeiptr idx_buffer_size;
  GLsizeiptr vtx_buffer_size;
  ImDrawList *cmd_list;
  int n;
  ImVec2 clip_scale;
  ImVec2 clip_off;
  GLuint vertex_array_object;
  GLboolean last_enable_primitive_restart;
  GLboolean last_enable_scissor_test;
  GLboolean last_enable_stencil_test;
  GLboolean last_enable_depth_test;
  GLboolean last_enable_cull_face;
  GLboolean last_enable_blend;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLuint last_vertex_array_object;
  GLuint last_array_buffer;
  GLuint last_sampler;
  GLuint last_texture;
  GLuint last_program;
  GLenum last_active_texture;
  ImGui_ImplOpenGL3_Data *bd;
  int fb_height;
  int fb_width;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImDrawCmd *local_b8;
  int local_ac;
  long local_a8;
  long local_a0;
  ImDrawList *local_98;
  int local_90;
  undefined8 local_8c;
  undefined8 local_84;
  undefined4 local_7c;
  char local_76;
  char local_75;
  char local_74;
  char local_73;
  char local_72;
  char local_71;
  uint local_70;
  uint in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  ImGui_ImplOpenGL3_Data *local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_c = (int)(*(float *)(in_RDI + 0x28) * *(float *)(in_RDI + 0x30));
  local_10 = (int)(*(float *)(in_RDI + 0x2c) * *(float *)(in_RDI + 0x34));
  if ((0 < local_c) && (0 < local_10)) {
    local_8 = in_RDI;
    local_18 = ImGui_ImplOpenGL3_GetBackendData();
    (*imgl3wProcs.ptr[0x22])(0x84e0,&local_1c);
    (*imgl3wProcs.ptr[0])(0x84c0);
    (*imgl3wProcs.ptr[0x22])(0x8b8d,&local_20);
    (*imgl3wProcs.ptr[0x22])(0x8069,&local_24);
    if ((local_18->GlVersion < 0x14a) && ((local_18->GlProfileIsES3 & 1U) == 0)) {
      local_28 = 0;
    }
    else {
      (*imgl3wProcs.ptr[0x22])(0x8919,&local_28);
    }
    (*imgl3wProcs.ptr[0x22])(0x8894,&local_2c);
    (*imgl3wProcs.ptr[0x22])(0x85b5,&local_30);
    if ((local_18->HasPolygonMode & 1U) != 0) {
      (*imgl3wProcs.ptr[0x22])(0xb40,&local_38);
    }
    (*imgl3wProcs.ptr[0x22])(0xba2,&local_48);
    (*imgl3wProcs.ptr[0x22])(0xc10,&local_58);
    (*imgl3wProcs.ptr[0x22])(0x80c9,&stack0xffffffffffffffa4);
    (*imgl3wProcs.ptr[0x22])(0x80c8,&stack0xffffffffffffffa0);
    (*imgl3wProcs.ptr[0x22])(0x80cb,&stack0xffffffffffffff9c);
    (*imgl3wProcs.ptr[0x22])(0x80ca,&stack0xffffffffffffff98);
    (*imgl3wProcs.ptr[0x22])(0x8009,&stack0xffffffffffffff94);
    (*imgl3wProcs.ptr[0x22])(0x883d,&local_70);
    local_71 = (*imgl3wProcs.ptr[0x2c])(0xbe2);
    local_72 = (*imgl3wProcs.ptr[0x2c])(0xb44);
    local_73 = (*imgl3wProcs.ptr[0x2c])(0xb71);
    local_74 = (*imgl3wProcs.ptr[0x2c])(0xb90);
    local_75 = (*imgl3wProcs.ptr[0x2c])(0xc11);
    if (local_18->GlVersion < 0x136) {
      local_76 = '\0';
    }
    else {
      local_76 = (*imgl3wProcs.ptr[0x2c])(0x8f9d);
    }
    local_7c = 0;
    (*imgl3wProcs.ptr[0x1f])(1,&local_7c);
    ImGui_ImplOpenGL3_SetupRenderState
              ((ImDrawData *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    local_84 = *(undefined8 *)(local_8 + 0x20);
    local_8c = *(undefined8 *)(local_8 + 0x30);
    for (local_90 = 0; local_90 < *(int *)(local_8 + 4); local_90 = local_90 + 1) {
      ppIVar3 = ImVector<ImDrawList_*>::operator[]
                          ((ImVector<ImDrawList_*> *)(local_8 + 0x10),local_90);
      local_98 = *ppIVar3;
      local_a0 = (long)(local_98->VtxBuffer).Size * 0x14;
      local_a8 = (long)(local_98->IdxBuffer).Size << 2;
      if ((local_18->UseBufferSubData & 1U) == 0) {
        (*imgl3wProcs.ptr[9])(0x8892,local_a0,(local_98->VtxBuffer).Data,0x88e0);
        (*imgl3wProcs.ptr[9])(0x8893,local_a8,(local_98->IdxBuffer).Data,0x88e0);
      }
      else {
        if (local_18->VertexBufferSize < local_a0) {
          local_18->VertexBufferSize = local_a0;
          (*imgl3wProcs.ptr[9])(0x8892,local_18->VertexBufferSize,0,0x88e0);
        }
        if (local_18->IndexBufferSize < local_a8) {
          local_18->IndexBufferSize = local_a8;
          (*imgl3wProcs.ptr[9])(0x8893,local_18->IndexBufferSize,0,0x88e0);
        }
        (*imgl3wProcs.ptr[10])(0x8892,0,local_a0,(local_98->VtxBuffer).Data);
        (*imgl3wProcs.ptr[10])(0x8893,0,local_a8,(local_98->IdxBuffer).Data);
      }
      for (local_ac = 0; local_ac < (local_98->CmdBuffer).Size; local_ac = local_ac + 1) {
        local_b8 = ImVector<ImDrawCmd>::operator[](&local_98->CmdBuffer,local_ac);
        if (local_b8->UserCallback == (ImDrawCallback)0x0) {
          ImVec2::ImVec2(&local_c0,((local_b8->ClipRect).x - (float)local_84) * (float)local_8c,
                         ((local_b8->ClipRect).y - local_84._4_4_) * local_8c._4_4_);
          ImVec2::ImVec2(&local_c8,((local_b8->ClipRect).z - (float)local_84) * (float)local_8c,
                         ((local_b8->ClipRect).w - local_84._4_4_) * local_8c._4_4_);
          if ((local_c0.x < local_c8.x) && (local_c0.y < local_c8.y)) {
            (*imgl3wProcs.ptr[0x32])
                      ((ulong)(uint)(int)local_c0.x,(ulong)(uint)(int)((float)local_10 - local_c8.y)
                       ,(ulong)(uint)(int)(local_c8.x - local_c0.x),
                       (ulong)(uint)(int)(local_c8.y - local_c0.y));
            uVar1 = imgl3wProcs.ptr[4];
            pvVar4 = ImDrawCmd::GetTexID(local_b8);
            (*(code *)uVar1)(0xde1,(ulong)pvVar4 & 0xffffffff);
            if (local_18->GlVersion < 0x140) {
              (*imgl3wProcs.ptr[0x18])
                        (4,(ulong)local_b8->ElemCount,0x1405,(ulong)local_b8->IdxOffset << 2);
            }
            else {
              (*imgl3wProcs.ptr[0x19])
                        (4,(ulong)local_b8->ElemCount,0x1405,(ulong)local_b8->IdxOffset << 2,
                         (ulong)local_b8->VtxOffset);
            }
          }
        }
        else if (local_b8->UserCallback == (ImDrawCallback)0xfffffffffffffff8) {
          ImGui_ImplOpenGL3_SetupRenderState
                    ((ImDrawData *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
        }
        else {
          (*local_b8->UserCallback)(local_98,local_b8);
        }
      }
    }
    (*imgl3wProcs.ptr[0x14])(1,&local_7c);
    if ((local_20 == 0) || (cVar2 = (*imgl3wProcs.ptr[0x2d])((ulong)local_20), cVar2 != '\0')) {
      (*imgl3wProcs.ptr[0x38])((ulong)local_20);
    }
    (*imgl3wProcs.ptr[4])(0xde1,(ulong)local_24);
    if ((0x149 < local_18->GlVersion) || ((local_18->GlProfileIsES3 & 1U) != 0)) {
      (*imgl3wProcs.ptr[3])(0,(ulong)local_28);
    }
    (*imgl3wProcs.ptr[0])((ulong)local_1c);
    (*imgl3wProcs.ptr[5])((ulong)local_30);
    (*imgl3wProcs.ptr[2])(0x8892,(ulong)local_2c);
    (*imgl3wProcs.ptr[7])((ulong)in_stack_ffffffffffffff94,(ulong)local_70);
    (*imgl3wProcs.ptr[8])
              ((ulong)in_stack_ffffffffffffffa4,(ulong)in_stack_ffffffffffffffa0,
               (ulong)in_stack_ffffffffffffff9c,(ulong)in_stack_ffffffffffffff98);
    if (local_71 == '\0') {
      (*imgl3wProcs.ptr[0x16])(0xbe2);
    }
    else {
      (*imgl3wProcs.ptr[0x1a])(0xbe2);
    }
    if (local_72 == '\0') {
      (*imgl3wProcs.ptr[0x16])(0xb44);
    }
    else {
      (*imgl3wProcs.ptr[0x1a])(0xb44);
    }
    if (local_73 == '\0') {
      (*imgl3wProcs.ptr[0x16])(0xb71);
    }
    else {
      (*imgl3wProcs.ptr[0x1a])(0xb71);
    }
    if (local_74 == '\0') {
      (*imgl3wProcs.ptr[0x16])(0xb90);
    }
    else {
      (*imgl3wProcs.ptr[0x1a])(0xb90);
    }
    if (local_75 == '\0') {
      (*imgl3wProcs.ptr[0x16])(0xc11);
    }
    else {
      (*imgl3wProcs.ptr[0x1a])(0xc11);
    }
    if (0x135 < local_18->GlVersion) {
      if (local_76 == '\0') {
        (*imgl3wProcs.ptr[0x16])(0x8f9d);
      }
      else {
        (*imgl3wProcs.ptr[0x1a])(0x8f9d);
      }
    }
    if ((local_18->HasPolygonMode & 1U) != 0) {
      if ((local_18->GlVersion < 0x137) || ((local_18->GlProfileIsCompat & 1U) != 0)) {
        (*imgl3wProcs.ptr[0x30])(0x404,(ulong)local_38);
        (*imgl3wProcs.ptr[0x30])(0x405,(ulong)local_34);
      }
      else {
        (*imgl3wProcs.ptr[0x30])(0x408,(ulong)local_38);
      }
    }
    (*imgl3wProcs.ptr[0x3a])((ulong)local_48,(ulong)local_44,(ulong)local_40,(ulong)local_3c);
    (*imgl3wProcs.ptr[0x32])((ulong)local_58,(ulong)local_54,(ulong)local_50,(ulong)local_4c);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLuint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, (GLint*)&last_program);
    GLuint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, (GLint*)&last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    GLuint last_sampler; if (bd->GlVersion >= 330 || bd->GlProfileIsES3) { glGetIntegerv(GL_SAMPLER_BINDING, (GLint*)&last_sampler); } else { last_sampler = 0; }
#endif
    GLuint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, (GLint*)&last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    // This is part of VAO on OpenGL 3.0+ and OpenGL ES 3.0+.
    GLint last_element_array_buffer; glGetIntegerv(GL_ELEMENT_ARRAY_BUFFER_BINDING, &last_element_array_buffer);
    ImGui_ImplOpenGL3_VtxAttribState last_vtx_attrib_state_pos; last_vtx_attrib_state_pos.GetState(bd->AttribLocationVtxPos);
    ImGui_ImplOpenGL3_VtxAttribState last_vtx_attrib_state_uv; last_vtx_attrib_state_uv.GetState(bd->AttribLocationVtxUV);
    ImGui_ImplOpenGL3_VtxAttribState last_vtx_attrib_state_color; last_vtx_attrib_state_color.GetState(bd->AttribLocationVtxColor);
#endif
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    GLuint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, (GLint*)&last_vertex_array_object);
#endif
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE
    GLint last_polygon_mode[2]; if (bd->HasPolygonMode) { glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode); }
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_stencil_test = glIsEnabled(GL_STENCIL_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    GLboolean last_enable_primitive_restart = (bd->GlVersion >= 310) ? glIsEnabled(GL_PRIMITIVE_RESTART) : GL_FALSE;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    GL_CALL(glGenVertexArrays(1, &vertex_array_object));
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        // - OpenGL drivers are in a very sorry state nowadays....
        //   During 2021 we attempted to switch from glBufferData() to orphaning+glBufferSubData() following reports
        //   of leaks on Intel GPU when using multi-viewports on Windows.
        // - After this we kept hearing of various display corruptions issues. We started disabling on non-Intel GPU, but issues still got reported on Intel.
        // - We are now back to using exclusively glBufferData(). So bd->UseBufferSubData IS ALWAYS FALSE in this code.
        //   We are keeping the old code path for a while in case people finding new issues may want to test the bd->UseBufferSubData path.
        // - See https://github.com/ocornut/imgui/issues/4468 and please report any corruption issues.
        const GLsizeiptr vtx_buffer_size = (GLsizeiptr)cmd_list->VtxBuffer.Size * (int)sizeof(ImDrawVert);
        const GLsizeiptr idx_buffer_size = (GLsizeiptr)cmd_list->IdxBuffer.Size * (int)sizeof(ImDrawIdx);
        if (bd->UseBufferSubData)
        {
            if (bd->VertexBufferSize < vtx_buffer_size)
            {
                bd->VertexBufferSize = vtx_buffer_size;
                GL_CALL(glBufferData(GL_ARRAY_BUFFER, bd->VertexBufferSize, nullptr, GL_STREAM_DRAW));
            }
            if (bd->IndexBufferSize < idx_buffer_size)
            {
                bd->IndexBufferSize = idx_buffer_size;
                GL_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, bd->IndexBufferSize, nullptr, GL_STREAM_DRAW));
            }
            GL_CALL(glBufferSubData(GL_ARRAY_BUFFER, 0, vtx_buffer_size, (const GLvoid*)cmd_list->VtxBuffer.Data));
            GL_CALL(glBufferSubData(GL_ELEMENT_ARRAY_BUFFER, 0, idx_buffer_size, (const GLvoid*)cmd_list->IdxBuffer.Data));
        }
        else
        {
            GL_CALL(glBufferData(GL_ARRAY_BUFFER, vtx_buffer_size, (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW));
            GL_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, idx_buffer_size, (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW));
        }

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != nullptr)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec2 clip_min((pcmd->ClipRect.x - clip_off.x) * clip_scale.x, (pcmd->ClipRect.y - clip_off.y) * clip_scale.y);
                ImVec2 clip_max((pcmd->ClipRect.z - clip_off.x) * clip_scale.x, (pcmd->ClipRect.w - clip_off.y) * clip_scale.y);
                if (clip_max.x <= clip_min.x || clip_max.y <= clip_min.y)
                    continue;

                // Apply scissor/clipping rectangle (Y is inverted in OpenGL)
                GL_CALL(glScissor((int)clip_min.x, (int)((float)fb_height - clip_max.y), (int)(clip_max.x - clip_min.x), (int)(clip_max.y - clip_min.y)));

                // Bind texture, Draw
                GL_CALL(glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->GetTexID()));
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                if (bd->GlVersion >= 320)
                    GL_CALL(glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset));
                else
#endif
                GL_CALL(glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx))));
            }
        }
    }

    // Destroy the temporary VAO
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    GL_CALL(glDeleteVertexArrays(1, &vertex_array_object));
#endif

    // Restore modified GL state
    // This "glIsProgram()" check is required because if the program is "pending deletion" at the time of binding backup, it will have been deleted by now and will cause an OpenGL error. See #6220.
    if (last_program == 0 || glIsProgram(last_program)) glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    if (bd->GlVersion >= 330 || bd->GlProfileIsES3)
        glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, last_element_array_buffer);
    last_vtx_attrib_state_pos.SetState(bd->AttribLocationVtxPos);
    last_vtx_attrib_state_uv.SetState(bd->AttribLocationVtxUV);
    last_vtx_attrib_state_color.SetState(bd->AttribLocationVtxColor);
#endif
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_stencil_test) glEnable(GL_STENCIL_TEST); else glDisable(GL_STENCIL_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    if (bd->GlVersion >= 310) { if (last_enable_primitive_restart) glEnable(GL_PRIMITIVE_RESTART); else glDisable(GL_PRIMITIVE_RESTART); }
#endif

#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE
    // Desktop OpenGL 3.0 and OpenGL 3.1 had separate polygon draw modes for front-facing and back-facing faces of polygons
    if (bd->HasPolygonMode) { if (bd->GlVersion <= 310 || bd->GlProfileIsCompat) { glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]); } else { glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]); } }
#endif // IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE

    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    (void)bd; // Not all compilation paths use this
}